

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall Array::Array(Array *this,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  int local_1c;
  int i;
  int height_local;
  int width_local;
  Array *this_local;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  this->_width = width;
  this->_height = height;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->_height;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar4 = (int **)operator_new__(uVar3);
  this->_data = ppiVar4;
  for (local_1c = 0; local_1c < this->_height; local_1c = local_1c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->_width;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar3);
    this->_data[local_1c] = piVar5;
  }
  return;
}

Assistant:

Array::Array(int width, int height)
	:_width(width)
	,_height(height)
{
	_data = new int*[_height];

	for (int i = 0; i < _height; ++i) {
		_data[i] = new int[_width];
	}
}